

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DrawBuffersIndexedTest::DrawBuffersIndexedTest
          (DrawBuffersIndexedTest *this,Context *context,BlendState *preCommonBlendState,
          BlendState *postCommonBlendState,
          vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
          *drawBuffers,string *name,string *description)

{
  char *name_00;
  char *description_00;
  string *name_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *drawBuffers_local;
  BlendState *postCommonBlendState_local;
  BlendState *preCommonBlendState_local;
  Context *context_local;
  DrawBuffersIndexedTest *this_local;
  
  name_00 = (char *)std::__cxx11::string::c_str();
  description_00 = (char *)std::__cxx11::string::c_str();
  gles31::TestCase::TestCase(&this->super_TestCase,context,name_00,description_00);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawBuffersIndexedTest_032c0000;
  BlendState::BlendState(&this->m_preCommonBlendState,preCommonBlendState);
  BlendState::BlendState(&this->m_postCommonBlendState,postCommonBlendState);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ::vector(&this->m_drawBuffers,drawBuffers);
  return;
}

Assistant:

DrawBuffersIndexedTest::DrawBuffersIndexedTest (Context&						context,
												const BlendState&				preCommonBlendState,
												const BlendState&				postCommonBlendState,
												const vector<DrawBufferInfo>&	drawBuffers,
												const string&					name,
												const string&					description)
	: TestCase					(context, name.c_str(), description.c_str())
	, m_preCommonBlendState		(preCommonBlendState)
	, m_postCommonBlendState	(postCommonBlendState)
	, m_drawBuffers				(drawBuffers)
{
}